

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O3

int numchanges(int np,poly *sseq,double a)

{
  int iVar1;
  long lVar2;
  poly *ppVar3;
  poly *ppVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = (long)sseq->ord;
  dVar5 = sseq->coef[lVar2];
  if (0 < lVar2) {
    lVar2 = lVar2 * 8 + 8;
    do {
      dVar5 = dVar5 * a + *(double *)((long)sseq->coef + lVar2 + -0x10);
      lVar2 = lVar2 + -8;
    } while (0xf < lVar2);
  }
  if (0 < np) {
    ppVar3 = sseq + np;
    ppVar4 = sseq + 1;
    iVar1 = 0;
    do {
      lVar2 = (long)ppVar4->ord;
      dVar6 = sseq[1].coef[lVar2];
      if (0 < lVar2) {
        lVar2 = lVar2 * 8 + 0x218;
        do {
          dVar6 = dVar6 * a + *(double *)((long)sseq->coef + lVar2 + -0x10);
          lVar2 = lVar2 + -8;
        } while (0x21f < lVar2);
      }
      iVar1 = iVar1 + (uint)(dVar5 * dVar6 < 0.0 || dVar5 == 0.0);
      ppVar4 = ppVar4 + 1;
      sseq = sseq + 1;
      dVar5 = dVar6;
    } while (ppVar4 <= ppVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int numchanges(int np, poly *sseq, double a)
{
	int changes = 0;

	double lf = evalpoly(sseq[0].ord, sseq[0].coef, a);

	poly *s;
	for (s = sseq + 1; s <= sseq + np; s++) {
		double f = evalpoly(s->ord, s->coef, a);
		if (lf == 0.0 || lf * f < 0)
			changes++;
		lf = f;
	}

	return(changes);
}